

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StructDatePart::Bind
          (StructDatePart *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pVVar1;
  pointer pcVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  DatePartSpecifier DVar5;
  ScalarFunction *pSVar6;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var7;
  int iVar8;
  reference pvVar9;
  pointer pEVar10;
  type expr;
  vector<duckdb::Value,_true> *pvVar11;
  iterator iVar12;
  BindData *this_00;
  BinderException *pBVar13;
  ParameterNotResolvedException *this_01;
  pointer this_02;
  DatePartSpecifier part_code;
  part_codes_t part_codes;
  string part_name;
  child_list_t<LogicalType> struct_children;
  Value parts_list;
  case_insensitive_set_t name_collision_set;
  DatePartSpecifier local_219;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
  local_218;
  ScalarFunction *local_1f0;
  part_codes_t local_1e8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_1d0;
  string local_1c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_1a8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_188;
  child_list_t<LogicalType> local_180;
  Value local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  iVar8 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[6])(pEVar10);
  if ((char)iVar8 != '\0') {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar9);
  iVar8 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar10);
  if ((char)iVar8 == '\0') {
    pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
    local_168.type_._0_8_ = (long)&local_168 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"%s can only take constant lists of part names","");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    pcVar2 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
             _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,
               pcVar2 + (bound_function->super_BaseScalarFunction).super_SimpleFunction.
                        super_Function.name._M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar13,(string *)&local_168,&local_88);
    __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_1a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
  super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (DatePartSpecifier *)0x0;
  local_1e8.super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
  super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
  super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (DatePartSpecifier *)0x0;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   (pvVar9);
  ExpressionExecutor::EvaluateScalar(&local_168,context,expr,false);
  if ((string)local_168.type_.id_ != (string)0x65) {
    pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
    local_218.first._M_dataplus._M_p = (pointer)&local_218.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,"%s can only take constant lists of part names","");
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    pcVar2 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
             _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar2,
               pcVar2 + (bound_function->super_BaseScalarFunction).super_SimpleFunction.
                        super_Function.name._M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar13,&local_218.first,&local_128);
    __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar11 = ListValue::GetChildren(&local_168);
  this_02 = (pvVar11->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar1 = (pvVar11->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1f0 = bound_function;
  local_1d0 = arguments;
  local_188._M_head_impl = (FunctionData *)this;
  if (this_02 != pVVar1) {
    while( true ) {
      if (this_02->is_null == true) {
        pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
        local_218.first._M_dataplus._M_p = (pointer)&local_218.first.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,"NULL struct entry name in %s","");
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar2 = (local_1f0->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar2,
                   pcVar2 + (local_1f0->super_BaseScalarFunction).super_SimpleFunction.
                            super_Function.name._M_string_length);
        BinderException::BinderException<std::__cxx11::string>(pBVar13,&local_218.first,&local_c8);
        __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      Value::ToString_abi_cxx11_(&local_1c8,this_02);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](local_1d0,1);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar9);
      local_219 = GetDateTypePartSpecifier(&local_1c8,&pEVar10->return_type);
      iVar12 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&local_68,&local_1c8);
      if (iVar12.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) break;
      local_218.first._M_dataplus._M_p = (pointer)&local_68;
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&local_1c8,&local_218);
      if (local_1e8.
          super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
          super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_1e8.
          super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
          super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::DatePartSpecifier,std::allocator<duckdb::DatePartSpecifier>>::
        _M_realloc_insert<duckdb::DatePartSpecifier_const&>
                  ((vector<duckdb::DatePartSpecifier,std::allocator<duckdb::DatePartSpecifier>> *)
                   &local_1e8,
                   (iterator)
                   local_1e8.
                   super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                   .
                   super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_219);
      }
      else {
        *local_1e8.
         super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
         super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_219;
        local_1e8.
        super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
        super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_1e8.
             super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
             super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      DVar5 = local_219;
      local_218.first._M_dataplus._M_p = (pointer)&local_218.first.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_1c8._M_dataplus._M_p,
                 local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
      local_218.second = (TIMEZONE_MINUTE < DVar5) * '\t' + BIGINT;
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalTypeId>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&local_1a8,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218.first._M_dataplus._M_p != &local_218.first.field_2) {
        operator_delete(local_218.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      pSVar6 = local_1f0;
      this_02 = this_02 + 1;
      if (this_02 == pVVar1) {
        Function::EraseArgument((SimpleFunction *)local_1f0,local_1d0,0);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)&local_180,&local_1a8);
        _Var7._M_head_impl = (FunctionData *)local_188;
        LogicalType::STRUCT((LogicalType *)&local_218,&local_180);
        (pSVar6->super_BaseScalarFunction).return_type.id_ =
             (LogicalTypeId)local_218.first._M_dataplus._M_p;
        (pSVar6->super_BaseScalarFunction).return_type.physical_type_ =
             local_218.first._M_dataplus._M_p._1_1_;
        peVar3 = (pSVar6->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var4 = (pSVar6->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pSVar6->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_218.first._M_string_length;
        (pSVar6->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_218.first.field_2._M_allocated_capacity;
        local_218.first._M_string_length = (size_type)peVar3;
        local_218.first.field_2._M_allocated_capacity = (size_type)p_Var4;
        LogicalType::~LogicalType((LogicalType *)&local_218);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_180);
        this_00 = (BindData *)operator_new(0x38);
        BindData::BindData(this_00,&(pSVar6->super_BaseScalarFunction).return_type,&local_1e8);
        *_Var7._M_head_impl = (FunctionData)this_00;
        Value::~Value(&local_168);
        if (local_1e8.
            super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
            super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.
                          super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                          .
                          super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_1a8);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_68);
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               )_Var7._M_head_impl;
      }
    }
    pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
    local_218.first._M_dataplus._M_p = (pointer)&local_218.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,"Duplicate struct entry name \"%s\" in %s","");
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_1c8._M_dataplus._M_p,
               local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    pcVar2 = (local_1f0->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
             _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar2,
               pcVar2 + (local_1f0->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                        name._M_string_length);
    BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
              (pBVar13,&local_218.first,&local_e8,&local_108);
    __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
  local_218.first._M_dataplus._M_p = (pointer)&local_218.first.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"%s requires non-empty lists of part names","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar2 = (local_1f0->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
           _M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,
             pcVar2 + (local_1f0->super_BaseScalarFunction).super_SimpleFunction.super_Function.name
                      ._M_string_length);
  BinderException::BinderException<std::__cxx11::string>(pBVar13,&local_218.first,&local_a8);
  __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, ScalarFunction &bound_function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		// collect names and deconflict, construct return type
		if (arguments[0]->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!arguments[0]->IsFoldable()) {
			throw BinderException("%s can only take constant lists of part names", bound_function.name);
		}

		case_insensitive_set_t name_collision_set;
		child_list_t<LogicalType> struct_children;
		part_codes_t part_codes;

		Value parts_list = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
		if (parts_list.type().id() == LogicalTypeId::LIST) {
			auto &list_children = ListValue::GetChildren(parts_list);
			if (list_children.empty()) {
				throw BinderException("%s requires non-empty lists of part names", bound_function.name);
			}
			for (const auto &part_value : list_children) {
				if (part_value.IsNull()) {
					throw BinderException("NULL struct entry name in %s", bound_function.name);
				}
				const auto part_name = part_value.ToString();
				const auto part_code = GetDateTypePartSpecifier(part_name, arguments[1]->return_type);
				if (name_collision_set.find(part_name) != name_collision_set.end()) {
					throw BinderException("Duplicate struct entry name \"%s\" in %s", part_name, bound_function.name);
				}
				name_collision_set.insert(part_name);
				part_codes.emplace_back(part_code);
				const auto part_type = IsBigintDatepart(part_code) ? LogicalType::BIGINT : LogicalType::DOUBLE;
				struct_children.emplace_back(make_pair(part_name, part_type));
			}
		} else {
			throw BinderException("%s can only take constant lists of part names", bound_function.name);
		}

		Function::EraseArgument(bound_function, arguments, 0);
		bound_function.return_type = LogicalType::STRUCT(struct_children);
		return make_uniq<BindData>(bound_function.return_type, part_codes);
	}